

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O0

TimeData *
helics::generateMinTimeTotal
          (TimeDependencies *dependencies,bool restricted,GlobalFederateId self,
          GlobalFederateId ignore,int32_t responseCode)

{
  bool bVar1;
  const_iterator cVar2;
  const_iterator mTime_00;
  reference dep_00;
  BaseType in_ECX;
  byte in_DL;
  TimeData *in_RDI;
  TimeData *mTime;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  TimeData *__lhs;
  GlobalFederateId in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  undefined2 uVar3;
  TimeData *in_stack_ffffffffffffffc8;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_ffffffffffffffd0;
  GlobalFederateId local_4;
  
  uVar3 = (undefined2)((ulong)in_stack_ffffffffffffffc0 >> 0x30);
  __lhs = in_RDI;
  local_4.gid = in_ECX;
  TimeRepresentation<count_time<9,_long>_>::maxVal();
  TimeData::TimeData(in_stack_ffffffffffffffc8,(Time)in_stack_ffffffffffffffd0._M_current,
                     (TimeState)((ushort)uVar3 >> 8),(uint8_t)uVar3);
  cVar2 = TimeDependencies::begin((TimeDependencies *)in_RDI);
  mTime_00 = TimeDependencies::end((TimeDependencies *)in_RDI);
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                           ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)__lhs,(__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                      *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    dep_00 = __gnu_cxx::
             __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator*((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                          *)&stack0xffffffffffffffd0);
    if (((dep_00->dependency & 1U) != 0) &&
       ((bVar1 = GlobalFederateId::isValid(&local_4), !bVar1 ||
        (in_stack_ffffffffffffffbc.gid = local_4.gid,
        bVar1 = GlobalFederateId::operator==(&(dep_00->super_TimeData).minFedActual,local_4), !bVar1
        )))) {
      generateMinTimeImplementation
                (&(mTime_00._M_current)->super_TimeData,dep_00,
                 (GlobalFederateId)(BaseType)((ulong)cVar2._M_current >> 0x20),
                 in_stack_ffffffffffffffbc.gid);
    }
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                  *)&stack0xffffffffffffffd0);
  }
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&__lhs->Te,&__lhs->minDe);
  if (bVar1) {
    (__lhs->minDe).internalTimeCode = (__lhs->Te).internalTimeCode;
  }
  if (((in_DL & 1) == 0) &&
     (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>(&__lhs->minDe,&__lhs->next), bVar1
     )) {
    (__lhs->next).internalTimeCode = (__lhs->minDe).internalTimeCode;
  }
  if (__lhs->mTimeState < time_granted) {
    (__lhs->next).internalTimeCode = -1;
    (__lhs->minDe).internalTimeCode = -1;
    (__lhs->Te).internalTimeCode = -1;
  }
  return in_RDI;
}

Assistant:

TimeData generateMinTimeTotal(const TimeDependencies& dependencies,
                              bool restricted,
                              GlobalFederateId self,
                              GlobalFederateId ignore,
                              std::int32_t responseCode)
{
    TimeData mTime(Time::maxVal(), TimeState::error);
    for (const auto& dep : dependencies) {
        if (!dep.dependency) {
            continue;
        }

        if (self.isValid() && dep.minFedActual == self) {
            continue;
        }
        generateMinTimeImplementation(mTime, dep, ignore, responseCode);
    }

    if (mTime.Te < mTime.minDe) {
        mTime.minDe = mTime.Te;
    }

    if (!restricted) {
        if (mTime.minDe > mTime.next) {
            mTime.next = mTime.minDe;
        }
    }
    if (mTime.mTimeState < TimeState::time_granted) {
        mTime.next = initializationTime;
        mTime.minDe = initializationTime;
        mTime.Te = initializationTime;
    }
    return mTime;
}